

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena-abandon.c
# Opt level: O3

_Bool mi_abandoned_visit_blocks
                (mi_subproc_id_t subproc_id,int heap_tag,_Bool visit_blocks,
                mi_block_visit_fun *visitor,void *arg)

{
  _Bool _Var1;
  _Bool _Var2;
  mi_segment_t *segment;
  mi_arena_field_cursor_t local_60;
  
  _Var1 = mi_option_is_enabled(mi_option_visit_abandoned);
  if (_Var1) {
    local_60.subproc = _mi_subproc_from_id(subproc_id);
    local_60.bitmap_idx = 0;
    local_60.visit_all = true;
    local_60.hold_visit_lock = false;
    local_60.os_list_count = (local_60.subproc)->abandoned_os_list_count;
    if (mi_arena_count == 0 || (local_60.subproc)->abandoned_count <= local_60.os_list_count) {
      local_60.end = 0;
    }
    else {
      local_60.end = mi_arena_count;
    }
    local_60.start = 0;
    do {
      segment = _mi_arena_segment_clear_abandoned_next(&local_60);
      _Var1 = segment == (mi_segment_t *)0x0;
      if (_Var1) break;
      _Var2 = _mi_segment_visit_blocks(segment,heap_tag,visit_blocks,visitor,arg);
      _mi_arena_segment_mark_abandoned(segment);
    } while (_Var2);
    if (local_60.hold_visit_lock == true) {
      pthread_mutex_unlock((pthread_mutex_t *)&(local_60.subproc)->abandoned_os_visit_lock);
    }
  }
  else {
    _Var1 = false;
    _mi_error_message(0xe,
                      "internal error: can only visit abandoned blocks when MIMALLOC_VISIT_ABANDONED=ON"
                     );
  }
  return _Var1;
}

Assistant:

bool mi_abandoned_visit_blocks(mi_subproc_id_t subproc_id, int heap_tag, bool visit_blocks, mi_block_visit_fun* visitor, void* arg) {
  // (unfortunately) the visit_abandoned option must be enabled from the start.
  // This is to avoid taking locks if abandoned list visiting is not required (as for most programs)
  if (!mi_option_is_enabled(mi_option_visit_abandoned)) {
    _mi_error_message(EFAULT, "internal error: can only visit abandoned blocks when MIMALLOC_VISIT_ABANDONED=ON");
    return false;
  }
  mi_arena_field_cursor_t current;
  _mi_arena_field_cursor_init(NULL, _mi_subproc_from_id(subproc_id), true /* visit all (blocking) */, &current);
  mi_segment_t* segment;
  bool ok = true;
  while (ok && (segment = _mi_arena_segment_clear_abandoned_next(&current)) != NULL) {
    ok = _mi_segment_visit_blocks(segment, heap_tag, visit_blocks, visitor, arg);
    _mi_arena_segment_mark_abandoned(segment);
  }
  _mi_arena_field_cursor_done(&current);
  return ok;
}